

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O0

void __thiscall ins_ekf::InsEkf::Update(InsEkf *this)

{
  Block<Eigen::Matrix<double,5,1,0,5,1>,_1,_1,false> *this_00;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>> *this_01;
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *this_02;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> *pMVar1;
  Block<Eigen::Matrix<double,5,15,0,5,15>,_1,_1,false> *pBVar2;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *pMVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  Scalar *pSVar7;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar8;
  size_t sVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  long lVar12;
  Scalar *pSVar13;
  Scalar *pSVar14;
  Vector3d *other_00;
  RealScalar __x;
  double dVar15;
  ReturnType RVar16;
  double dVar17;
  double dVar18;
  non_const_type local_22c8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_const_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_>
  local_22c0;
  double local_22a8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_const_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_>_>
  local_22a0;
  non_const_type local_2268;
  Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_5,_0,_5,_5>,_0>
  local_2260;
  Product<Eigen::Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_5,_0,_5,_5>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>,_0>
  local_2250;
  non_const_type local_2238;
  Product<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_0>
  local_2230;
  Product<Eigen::Product<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_0>
  local_2220;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_5,_0,_5,_5>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>,_0>_>
  local_2208;
  Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_15,_0,_5,_15>,_0>
  local_21d0;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,15,15,0,15,15>>>
  local_21bb [3];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_const_Eigen::Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_15,_0,_5,_15>,_0>_>
  local_21b8;
  Matrix<double,15,15,0,15,15> local_2198 [8];
  Matrix<double,_15,_15,_0,_15,_15> I_KH;
  Type local_1a58;
  Type local_1a20;
  Type local_19e8;
  RealScalar local_19b0;
  Vector4d local_19a8;
  RealScalar local_1980;
  Scalar local_1978;
  double local_1970;
  double local_1968;
  double local_1960;
  undefined1 local_1958 [8];
  Vector4d dq;
  Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_1,_0,_5,_1>,_0>
  local_1930;
  Matrix<double,15,1,0,15,1> local_1920 [8];
  Matrix<double,_15,_1,_0,_15,_1> dx;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,_5,_1,_0,_5,_1>_>
  local_1870;
  Matrix<double,5,1,0,5,1> local_1828 [8];
  Matrix<double,_5,_1,_0,_5,_1> residual;
  Product<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_Eigen::Transpose<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>,_0>
  local_17f8;
  Product<Eigen::Product<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_Eigen::Transpose<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>,_0>,_Eigen::Matrix<double,_5,_5,_0,_5,_5>,_0>
  local_17e8;
  Matrix<double,15,5,0,15,5> local_17d0 [8];
  Matrix<double,_15,_5,_0,_15,_5> K;
  LLT<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_2> local_1570;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_5,_5,_0,_5,_5>_>_>
  local_1493 [3];
  Matrix<double,5,5,0,5,5> local_1490 [8];
  Matrix<double,_5,_5,_0,_5,_5> S_inverse;
  Product<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_0>
  local_13c0;
  Product<Eigen::Product<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>,_0>
  local_13b0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>,_0>,_const_Eigen::Matrix<double,_5,_5,_0,_5,_5>_>
  local_1398;
  Matrix<double,5,5,0,5,5> local_1370 [8];
  Matrix<double,_5,_5,_0,_5,_5> S;
  Matrix<double,5,5,0,5,5> local_12a0 [8];
  Matrix<double,_5,_5,_0,_5,_5> Q_gps_diag;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>> local_11a0 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> local_1168 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>> local_1130 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> local_10f8 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>> local_10c0 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> local_1088 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>> local_1050 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> local_1018 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>> local_fe0 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> local_fa8 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>> local_f70 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> local_f38 [48];
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_f08 [72];
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
  local_ec0 [16];
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>
  local_eb0;
  Matrix<double,3,1,0,3,1> local_e70 [8];
  Vector3d d_gps_roI_d_yaw;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_e28 [72];
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
  local_de0 [16];
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_dd0;
  Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>
  local_db8;
  Matrix<double,3,1,0,3,1> local_d70 [8];
  Vector3d d_gps_roI_d_pitch;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_d28 [72];
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
  local_ce0 [16];
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_cd0;
  Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_cb8;
  Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>
  local_c98;
  Matrix<double,3,1,0,3,1> local_c48 [8];
  Vector3d d_gps_roI_d_roll;
  Scalar local_c28;
  Scalar local_c20;
  Matrix<double,_3,_1,_0,_3,_1> local_c18;
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> local_c00 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_bb8;
  Matrix<double,3,1,0,3,1> local_ba8 [24];
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_b90 [8];
  Vector3d d_gps_roI_d_biasGr;
  Scalar local_b70;
  Scalar local_b68;
  Matrix<double,_3,_1,_0,_3,_1> local_b60;
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> local_b48 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_b00;
  Matrix<double,3,1,0,3,1> local_af0 [24];
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_ad8 [8];
  Vector3d d_gps_roI_d_biasGq;
  Scalar local_ab8;
  Scalar local_ab0;
  Matrix<double,_3,_1,_0,_3,_1> local_aa8;
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> local_a90 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_a48;
  Matrix<double,3,1,0,3,1> local_a38 [24];
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_a20 [8];
  Vector3d d_gps_roI_d_biasGp;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> local_9d0 [48];
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_9a0 [72];
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
  local_958 [16];
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>
  local_948;
  Block<Eigen::Matrix<double,5,15,0,5,15>,_1,_1,false> local_908 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> local_8d0 [48];
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_8a0 [72];
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
  local_858 [16];
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_848;
  Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>
  local_830;
  Block<Eigen::Matrix<double,5,15,0,5,15>,_1,_1,false> local_7e8 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> local_7b0 [48];
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_780 [72];
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
  local_738 [16];
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_728;
  Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_710;
  Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>
  local_6f0;
  Scalar local_6a0;
  Scalar local_698;
  Scalar local_690;
  Matrix<double,_3,_1,_0,_3,_1> local_688;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_670 [8];
  Matrix3d R_pitch;
  Scalar local_620;
  Scalar local_618;
  Matrix<double,_3,_1,_0,_3,_1> local_610;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_5f8 [8];
  Matrix3d R_yaw;
  Matrix<double,3,3,0,3,3> local_5a8 [8];
  Matrix3d I_3;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_523 [3];
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_5,_15,_0,_5,_15>_>_>
  local_520 [16];
  Matrix<double,5,15,0,5,15> local_510 [8];
  Matrix<double,_5,_15,_0,_5,_15> H;
  double Vxy_norm;
  Matrix<double,3,1,0,3,1> local_260 [8];
  Vector3d gps_velocity_I;
  Vector3d gps_rot_offset_I;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_1e8;
  Matrix<double,3,1,0,3,1> local_1d8 [8];
  Vector3d gps_rot_offset;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_188;
  Matrix<double,3,1,0,3,1> local_140 [8];
  Vector3d pqr_est;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_f0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_d8 [8];
  Vector3d gps_offset_I;
  Scalar local_a8;
  Scalar local_a0;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_98;
  undefined1 local_78 [8];
  Vector4d q_BtoI;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
  local_50 [16];
  Matrix<double,5,1,0,5,1> local_40 [8];
  Matrix<double,_5,_1,_0,_5,_1> h;
  size_t gps_start;
  InsEkf *this_local;
  
  bVar6 = Eigen::DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>::hasNaN
                    ((DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *)&this->last_measurements_
                    );
  if (!bVar6) {
    h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4] =
         (double)m_I(gpsX);
    Eigen::DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::Zero();
    Eigen::Matrix<double,5,1,0,5,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,5,1,0,5,1>>>
              (local_40,local_50);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)local_78);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this,0);
    local_a0 = -*pSVar7;
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator<<
              (&local_98,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_78,&local_a0);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this,1);
    local_a8 = -*pSVar7;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                       (&local_98,&local_a8);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this,2);
    gps_offset_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [2] = -*pSVar7;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                       (pCVar8,gps_offset_I.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array + 2);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this,3);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar8,pSVar7);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer(&local_98);
    other_00 = &this->gps_offset_;
    RotateVectByQuat((Vector3d *)local_d8,(Vector4d *)local_78,other_00);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              (&local_f0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->position_,local_d8);
    sVar9 = m_I(gpsX);
    this_00 = (Block<Eigen::Matrix<double,5,1,0,5,1>,_1,_1,false> *)
              (pqr_est.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
               .array + 2);
    Eigen::DenseBase<Eigen::Matrix<double,5,1,0,5,1>>::block<int,int>
              ((Type *)this_00,(DenseBase<Eigen::Matrix<double,5,1,0,5,1>> *)local_40,
               sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                             m_storage.m_data.array[4],0,3,1);
    Eigen::Block<Eigen::Matrix<double,5,1,0,5,1>,-1,-1,false>::operator=
              (this_00,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_f0);
    sVar9 = m_I(p);
    this_01 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>> *)
              (gps_rot_offset.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
               .m_data.array + 2);
    Eigen::DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>::segment<int>
              ((Type *)this_01,
               (DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *)&this->last_measurements_,sVar9
               ,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,-1,1,false>>::operator-
              (&local_188,this_01,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->bias_g_);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (local_140,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_188);
    this_02 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
              (gps_rot_offset_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array + 2);
    SkewSymmetric((Matrix3d *)this_02,(Vector3d *)local_140);
    local_1e8 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          (this_02,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_00);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              (local_1d8,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_1e8);
    other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
            (gps_velocity_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array + 2);
    RotateVectByQuat((Vector3d *)other,(Vector4d *)local_78,(Vector3d *)local_1d8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)&Vxy_norm,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->velocity_,other);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (local_260,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&Vxy_norm);
    pMVar1 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> *)
             (H.super_PlainObjectBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>.m_storage.m_data.
              array + 0x4a);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::segment<int>
              ((Type *)pMVar1,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_260,0,2);
    __x = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_1,_false>_>::norm
                    (pMVar1);
    sVar9 = m_I(gpsV);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)local_40,
                         sVar9 - (long)h.
                                       super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                                       m_storage.m_data.array[4],0);
    *pSVar10 = __x;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,1);
    dVar15 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,0);
    dVar15 = atan2(dVar15,*pSVar11);
    sVar9 = m_I(gpsPsi);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)local_40,
                         sVar9 - (long)h.
                                       super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                                       m_storage.m_data.array[4],0);
    *pSVar10 = dVar15;
    Eigen::DenseBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>::Zero();
    Eigen::Matrix<double,5,15,0,5,15>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,5,15,0,5,15>>>
              (local_510,local_520);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    sVar9 = m_I(gpsX);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(x);
    pBVar2 = (Block<Eigen::Matrix<double,5,15,0,5,15>,_1,_1,false> *)
             (I_3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 8);
    Eigen::DenseBase<Eigen::Matrix<double,5,15,0,5,15>>::block<int,int>
              ((Type *)pBVar2,(DenseBase<Eigen::Matrix<double,5,15,0,5,15>> *)local_510,lVar12,sVar9
               ,3,3);
    Eigen::Block<Eigen::Matrix<double,5,15,0,5,15>,-1,-1,false>::operator=(pBVar2,local_523);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::Matrix<double,3,3,0,3,3>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
              (local_5a8,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)((long)R_yaw.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array + 0x45));
    local_618 = 0.0;
    local_620 = 0.0;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this,2);
    R_pitch.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         -*pSVar7;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              (&local_610,&local_618,&local_620,
               R_pitch.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
               .array + 8);
    RPYToRotMat((Matrix3d *)local_5f8,&local_610);
    local_690 = 0.0;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this,1);
    local_698 = -*pSVar7;
    local_6a0 = 0.0;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_688,&local_690,&local_698,&local_6a0);
    RPYToRotMat((Matrix3d *)local_670,&local_688);
    SkewSymmetric((Matrix3d *)local_780,(Vector3d *)local_d8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
              ((NegativeReturnType *)local_738,local_780);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(&local_728,local_738,local_5f8);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
    ::operator*(&local_710,
                (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                 *)&local_728,local_670);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              ((ColXpr *)local_7b0,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_5a8,0);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
    ::operator*(&local_6f0,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                 *)&local_710,local_7b0);
    sVar9 = m_I(gpsX);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(roll);
    Eigen::DenseBase<Eigen::Matrix<double,5,15,0,5,15>>::block<int,int>
              ((Type *)local_7e8,(DenseBase<Eigen::Matrix<double,5,15,0,5,15>> *)local_510,lVar12,
               sVar9,3,1);
    Eigen::Block<Eigen::Matrix<double,5,15,0,5,15>,-1,-1,false>::operator=
              (local_7e8,
               (DenseBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                *)&local_6f0);
    SkewSymmetric((Matrix3d *)local_8a0,(Vector3d *)local_d8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
              ((NegativeReturnType *)local_858,local_8a0);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(&local_848,local_858,local_5f8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              ((ColXpr *)local_8d0,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_5a8,1);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
    ::operator*(&local_830,
                (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                 *)&local_848,local_8d0);
    sVar9 = m_I(gpsX);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(pitch);
    Eigen::DenseBase<Eigen::Matrix<double,5,15,0,5,15>>::block<int,int>
              ((Type *)local_908,(DenseBase<Eigen::Matrix<double,5,15,0,5,15>> *)local_510,lVar12,
               sVar9,3,1);
    Eigen::Block<Eigen::Matrix<double,5,15,0,5,15>,-1,-1,false>::operator=
              (local_908,
               (DenseBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                *)&local_830);
    SkewSymmetric((Matrix3d *)local_9a0,(Vector3d *)local_d8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
              ((NegativeReturnType *)local_958,local_9a0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              ((ColXpr *)local_9d0,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_5a8,2);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(&local_948,local_958,local_9d0);
    sVar9 = m_I(gpsX);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(yaw);
    pBVar2 = (Block<Eigen::Matrix<double,5,15,0,5,15>,_1,_1,false> *)
             (d_gps_roI_d_biasGp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array + 2);
    Eigen::DenseBase<Eigen::Matrix<double,5,15,0,5,15>>::block<int,int>
              ((Type *)pBVar2,(DenseBase<Eigen::Matrix<double,5,15,0,5,15>> *)local_510,lVar12,sVar9
               ,3,1);
    Eigen::Block<Eigen::Matrix<double,5,15,0,5,15>,-1,-1,false>::operator=
              (pBVar2,(DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                       *)&local_948);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,0);
    dVar15 = *pSVar11;
    sVar9 = m_I(gpsV);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(Vx);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = dVar15 / __x;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,1);
    dVar15 = *pSVar11;
    sVar9 = m_I(gpsV);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(Vy);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = dVar15 / __x;
    local_ab0 = -1.0;
    local_ab8 = 0.0;
    d_gps_roI_d_biasGq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
    .array[2] = 0.0;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              (&local_aa8,&local_ab0,&local_ab8,
               d_gps_roI_d_biasGq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array + 2);
    SkewSymmetric((Matrix3d *)local_a90,&local_aa8);
    local_a48 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          (local_a90,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_00);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              (local_a38,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_a48);
    RotateVectByQuat((Vector3d *)local_a20,(Vector4d *)local_78,(Vector3d *)local_a38);
    local_b68 = 0.0;
    local_b70 = -1.0;
    d_gps_roI_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
    .array[2] = 0.0;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              (&local_b60,&local_b68,&local_b70,
               d_gps_roI_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array + 2);
    SkewSymmetric((Matrix3d *)local_b48,&local_b60);
    local_b00 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          (local_b48,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_00);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              (local_af0,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_b00);
    RotateVectByQuat((Vector3d *)local_ad8,(Vector4d *)local_78,(Vector3d *)local_af0);
    local_c20 = 0.0;
    local_c28 = 0.0;
    d_gps_roI_d_roll.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = -1.0;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              (&local_c18,&local_c20,&local_c28,
               d_gps_roI_d_roll.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array + 2);
    SkewSymmetric((Matrix3d *)local_c00,&local_c18);
    local_bb8 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          (local_c00,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_00);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              (local_ba8,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_bb8);
    RotateVectByQuat((Vector3d *)local_b90,(Vector4d *)local_78,(Vector3d *)local_ba8);
    SkewSymmetric((Matrix3d *)local_d28,(Vector3d *)other);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
              ((NegativeReturnType *)local_ce0,local_d28);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(&local_cd0,local_ce0,local_5f8);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
    ::operator*(&local_cb8,
                (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                 *)&local_cd0,local_670);
    pMVar3 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             (d_gps_roI_d_pitch.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array + 2);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              ((ColXpr *)pMVar3,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_5a8,0);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
    ::operator*(&local_c98,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                 *)&local_cb8,pMVar3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,0>>
              (local_c48,
               (EigenBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                *)&local_c98);
    SkewSymmetric((Matrix3d *)local_e28,(Vector3d *)other);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
              ((NegativeReturnType *)local_de0,local_e28);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(&local_dd0,local_de0,local_5f8);
    pMVar3 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             (d_gps_roI_d_yaw.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
              .m_data.array + 2);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              ((ColXpr *)pMVar3,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_5a8,1);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
    ::operator*(&local_db8,
                (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                 *)&local_dd0,pMVar3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,0>>
              (local_d70,
               (EigenBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                *)&local_db8);
    SkewSymmetric((Matrix3d *)local_f08,(Vector3d *)other);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
              ((NegativeReturnType *)local_ec0,local_f08);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              ((ColXpr *)local_f38,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_5a8,2);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(&local_eb0,local_ec0,local_f38);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,0>>
              (local_e70,
               (EigenBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                *)&local_eb0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::segment<int>
              ((Type *)local_f70,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_260,0,2);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::segment<int>
              ((Type *)local_fa8,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_c48,0,2);
    RVar16 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,1,false>>::
             dot<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>(local_f70,local_fa8);
    sVar9 = m_I(gpsV);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(roll);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = RVar16 / __x;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::segment<int>
              ((Type *)local_fe0,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_260,0,2);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::segment<int>
              ((Type *)local_1018,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_d70,0,2)
    ;
    RVar16 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,1,false>>::
             dot<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>(local_fe0,local_1018);
    sVar9 = m_I(gpsV);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(pitch);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = RVar16 / __x;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::segment<int>
              ((Type *)local_1050,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_260,0,2)
    ;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::segment<int>
              ((Type *)local_1088,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_e70,0,2)
    ;
    RVar16 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,1,false>>::
             dot<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>(local_1050,local_1088);
    sVar9 = m_I(gpsV);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(yaw);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = RVar16 / __x;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::segment<int>
              ((Type *)local_10c0,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_260,0,2)
    ;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::segment<int>
              ((Type *)local_10f8,local_a20,0,2);
    RVar16 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,1,false>>::
             dot<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>(local_10c0,local_10f8);
    sVar9 = m_I(gpsV);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(biasGp);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = RVar16 / __x;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::segment<int>
              ((Type *)local_1130,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_260,0,2)
    ;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::segment<int>
              ((Type *)local_1168,local_ad8,0,2);
    RVar16 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,1,false>>::
             dot<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>(local_1130,local_1168);
    sVar9 = m_I(gpsV);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(biasGq);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = RVar16 / __x;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::segment<int>
              ((Type *)local_11a0,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_260,0,2)
    ;
    pMVar1 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> *)
             (Q_gps_diag.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.
              m_data.array + 0x18);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::segment<int>
              ((Type *)pMVar1,local_b90,0,2);
    RVar16 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,1,false>>::
             dot<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>(local_11a0,pMVar1);
    sVar9 = m_I(gpsV);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(biasGr);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = RVar16 / __x;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,1);
    dVar15 = *pSVar11;
    dVar17 = pow(__x,2.0);
    sVar9 = m_I(gpsPsi);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(Vx);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = -dVar15 / dVar17;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,0);
    dVar15 = *pSVar11;
    dVar17 = pow(__x,2.0);
    sVar9 = m_I(gpsPsi);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(Vy);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = dVar15 / dVar17;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,0);
    dVar15 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_c48,1);
    dVar17 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,1);
    dVar4 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_c48,0);
    dVar5 = *pSVar11;
    dVar18 = pow(__x,2.0);
    sVar9 = m_I(gpsPsi);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(roll);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = (dVar15 * dVar17 - dVar4 * dVar5) / dVar18;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,0);
    dVar15 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_d70,1);
    dVar17 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,1);
    dVar4 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_d70,0);
    dVar5 = *pSVar11;
    dVar18 = pow(__x,2.0);
    sVar9 = m_I(gpsPsi);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(pitch);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = (dVar15 * dVar17 - dVar4 * dVar5) / dVar18;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,0);
    dVar15 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_e70,1);
    dVar17 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,1);
    dVar4 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_e70,0);
    dVar5 = *pSVar11;
    dVar18 = pow(__x,2.0);
    sVar9 = m_I(gpsPsi);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(yaw);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = (dVar15 * dVar17 - dVar4 * dVar5) / dVar18;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,0);
    dVar15 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_a20,1);
    dVar17 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,1);
    dVar4 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_a20,0);
    dVar5 = *pSVar11;
    dVar18 = pow(__x,2.0);
    sVar9 = m_I(gpsPsi);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(biasGp);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = (dVar15 * dVar17 - dVar4 * dVar5) / dVar18;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,0);
    dVar15 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_ad8,1);
    dVar17 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,1);
    dVar4 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_ad8,0);
    dVar5 = *pSVar11;
    dVar18 = pow(__x,2.0);
    sVar9 = m_I(gpsPsi);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(biasGq);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = (dVar15 * dVar17 - dVar4 * dVar5) / dVar18;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,0);
    dVar15 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_b90,1);
    dVar17 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_260,1);
    dVar4 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_b90,0);
    dVar5 = *pSVar11;
    dVar18 = pow(__x,2.0);
    sVar9 = m_I(gpsPsi);
    lVar12 = sVar9 - (long)h.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data.array[4];
    sVar9 = s_I(biasGr);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_1> *)local_510,
                         lVar12,sVar9);
    *pSVar13 = (dVar15 * dVar17 - dVar4 * dVar5) / dVar18;
    S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[0x18] =
         (double)Eigen::MatrixBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::asDiagonal
                           ((MatrixBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&this->Q_gps_);
    Eigen::Matrix<double,5,5,0,5,5>::
    Matrix<Eigen::DiagonalWrapper<Eigen::Matrix<double,5,1,0,5,1>const>>
              (local_12a0,
               (EigenBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_> *)
               (S.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
                array + 0x18));
    local_13c0 = Eigen::MatrixBase<Eigen::Matrix<double,5,15,0,5,15>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,5,15,0,5,15>> *)local_510,
                            (MatrixBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_> *)&this->P_);
    S_inverse.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array
    [0x18] = (double)Eigen::DenseBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>::transpose
                               ((DenseBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>_> *)local_510);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,5,15,0,5,15>,Eigen::Matrix<double,15,15,0,15,15>,0>>
    ::operator*(&local_13b0,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,5,15,0,5,15>,Eigen::Matrix<double,15,15,0,15,15>,0>>
                 *)&local_13c0,
                (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>_> *)
                (S_inverse.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.
                 m_data.array + 0x18));
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,5,15,0,5,15>,Eigen::Matrix<double,15,15,0,15,15>,0>,Eigen::Transpose<Eigen::Matrix<double,5,15,0,5,15>>,0>>
    ::operator+(&local_1398,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,5,15,0,5,15>,Eigen::Matrix<double,15,15,0,15,15>,0>,Eigen::Transpose<Eigen::Matrix<double,5,15,0,5,15>>,0>>
                 *)&local_13b0,(MatrixBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)local_12a0);
    Eigen::Matrix<double,5,5,0,5,5>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,5,15,0,5,15>,Eigen::Matrix<double,15,15,0,15,15>,0>,Eigen::Transpose<Eigen::Matrix<double,5,15,0,5,15>>,0>const,Eigen::Matrix<double,5,5,0,5,5>const>>
              (local_1370,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_5,_15,_0,_5,_15>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>,_0>,_const_Eigen::Matrix<double,_5,_5,_0,_5,_5>_>_>
                *)&local_1398);
    Eigen::MatrixBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>::Identity();
    Eigen::Matrix<double,5,5,0,5,5>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,5,5,0,5,5>>>
              (local_1490,local_1493);
    K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.array[0x4a] =
         (double)Eigen::MatrixBase<Eigen::Matrix<double,5,5,0,5,5>>::selfadjointView<2u>
                           ((MatrixBase<Eigen::Matrix<double,5,5,0,5,5>> *)local_1370);
    Eigen::SelfAdjointView<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_2U>::llt
              (&local_1570,
               (SelfAdjointView<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_2U> *)
               (K.super_PlainObjectBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>.m_storage.m_data.
                array + 0x4a));
    Eigen::LLT<Eigen::Matrix<double,5,5,0,5,5>,2>::solveInPlace<Eigen::Matrix<double,5,5,0,5,5>>
              ((LLT<Eigen::Matrix<double,5,5,0,5,5>,2> *)&local_1570,
               (MatrixBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)local_1490);
    Eigen::LLT<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_2>::~LLT(&local_1570);
    residual.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4]
         = (double)Eigen::DenseBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>::transpose
                             ((DenseBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>_> *)local_510);
    local_17f8 = Eigen::MatrixBase<Eigen::Matrix<double,15,15,0,15,15>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,15,15,0,15,15>> *)&this->P_,
                            (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>_>
                             *)(residual.
                                super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                                m_storage.m_data.array + 4));
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,15,15,0,15,15>,Eigen::Transpose<Eigen::Matrix<double,5,15,0,5,15>>,0>>
    ::operator*(&local_17e8,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,15,15,0,15,15>,Eigen::Transpose<Eigen::Matrix<double,5,15,0,5,15>>,0>>
                 *)&local_17f8,(MatrixBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)local_1490);
    Eigen::Matrix<double,15,5,0,15,5>::
    Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<double,15,15,0,15,15>,Eigen::Transpose<Eigen::Matrix<double,5,15,0,5,15>>,0>,Eigen::Matrix<double,5,5,0,5,5>,0>>
              (local_17d0,
               (EigenBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_Eigen::Transpose<Eigen::Matrix<double,_5,_15,_0,_5,_15>_>,_0>,_Eigen::Matrix<double,_5,_5,_0,_5,_5>,_0>_>
                *)&local_17e8);
    sVar9 = m_I(gpsX);
    Eigen::DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>::segment<int>
              ((Type *)(dx.super_PlainObjectBase<Eigen::Matrix<double,_15,_1,_0,_15,_1>_>.m_storage.
                        m_data.array + 0xe),
               (DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *)&this->last_measurements_,sVar9
               ,5);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,-1,1,false>>::operator-
              (&local_1870,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>> *)
               (dx.super_PlainObjectBase<Eigen::Matrix<double,_15,_1,_0,_15,_1>_>.m_storage.m_data.
                array + 0xe),(MatrixBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)local_40);
    Eigen::Matrix<double,5,1,0,5,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>const,Eigen::Matrix<double,5,1,0,5,1>const>>
              (local_1828,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
                *)&local_1870);
    local_1930 = Eigen::MatrixBase<Eigen::Matrix<double,15,5,0,15,5>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,15,5,0,15,5>> *)local_17d0,
                            (MatrixBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)local_1828);
    Eigen::Matrix<double,15,1,0,15,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,15,5,0,15,5>,Eigen::Matrix<double,5,1,0,5,1>,0>>
              (local_1920,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_1,_0,_5,_1>,_0>_>
                *)&local_1930);
    sVar9 = s_I(roll);
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_1,_0,_15,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_15,_1,_0,_15,_1>,_1> *)local_1920,
                         sVar9);
    local_1960 = *pSVar14 * 0.5;
    sVar9 = s_I(pitch);
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_1,_0,_15,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_15,_1,_0,_15,_1>,_1> *)local_1920,
                         sVar9);
    local_1968 = *pSVar14 * 0.5;
    sVar9 = s_I(yaw);
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_1,_0,_15,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_15,_1,_0,_15,_1>,_1> *)local_1920,
                         sVar9);
    local_1970 = *pSVar14 * 0.5;
    local_1978 = 1.0;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
              ((Matrix<double,_4,_1,_0,_4,_1> *)local_1958,&local_1960,&local_1968,&local_1970,
               &local_1978);
    local_1980 = Eigen::MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::norm
                           ((MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_1958);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_1958,&local_1980);
    QuatMultiply(&local_19a8,(Vector4d *)local_1958,&this->orientation_);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=(&this->orientation_,&local_19a8);
    local_19b0 = Eigen::MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::norm
                           ((MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)this);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)this,&local_19b0);
    sVar9 = s_I(x);
    Eigen::DenseBase<Eigen::Matrix<double,15,1,0,15,1>>::block<int,int>
              (&local_19e8,local_1920,sVar9,0,3,1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->position_,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,__1,__1,_false>_> *)
               &local_19e8);
    sVar9 = s_I(Vx);
    Eigen::DenseBase<Eigen::Matrix<double,15,1,0,15,1>>::block<int,int>
              (&local_1a20,local_1920,sVar9,0,3,1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->velocity_,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,__1,__1,_false>_> *)
               &local_1a20);
    sVar9 = s_I(biasGp);
    Eigen::DenseBase<Eigen::Matrix<double,15,1,0,15,1>>::block<int,int>
              (&local_1a58,local_1920,sVar9,0,3,1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->bias_g_,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,__1,__1,_false>_> *)
               &local_1a58);
    sVar9 = s_I(biasAx);
    Eigen::DenseBase<Eigen::Matrix<double,15,1,0,15,1>>::block<int,int>
              ((Type *)(I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.
                        m_storage.m_data.array + 0xe0),local_1920,sVar9,0,3,1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->bias_a_,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_15,_1,_0,_15,_1>,__1,__1,_false>_> *)
               (I_KH.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.
                m_data.array + 0xe0));
    Eigen::MatrixBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>::Identity();
    local_21d0 = Eigen::MatrixBase<Eigen::Matrix<double,15,5,0,15,5>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,15,5,0,15,5>> *)local_17d0,
                            (MatrixBase<Eigen::Matrix<double,_5,_15,_0,_5,_15>_> *)local_510);
    Eigen::
    MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,15,15,0,15,15>>>
    ::operator-(&local_21b8,local_21bb,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_15,_0,_5,_15>,_0>_>
                 *)&local_21d0);
    Eigen::Matrix<double,15,15,0,15,15>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,15,15,0,15,15>>const,Eigen::Product<Eigen::Matrix<double,15,5,0,15,5>,Eigen::Matrix<double,5,15,0,5,15>,0>const>>
              (local_2198,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_const_Eigen::Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_15,_0,_5,_15>,_0>_>_>
                *)&local_21b8);
    local_2230 = Eigen::MatrixBase<Eigen::Matrix<double,15,15,0,15,15>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,15,15,0,15,15>> *)local_2198,
                            (MatrixBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_> *)&this->P_);
    local_2238 = (non_const_type)
                 Eigen::DenseBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_> *)local_2198);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,15,15,0,15,15>,Eigen::Matrix<double,15,15,0,15,15>,0>>
    ::operator*(&local_2220,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,15,15,0,15,15>,Eigen::Matrix<double,15,15,0,15,15>,0>>
                 *)&local_2230,
                (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_> *)
                &local_2238);
    local_2260 = Eigen::MatrixBase<Eigen::Matrix<double,15,5,0,15,5>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,15,5,0,15,5>> *)local_17d0,
                            (MatrixBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)local_12a0);
    local_2268 = (non_const_type)
                 Eigen::DenseBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_15,_5,_0,_15,_5>_> *)local_17d0);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,15,5,0,15,5>,Eigen::Matrix<double,5,5,0,5,5>,0>>
    ::operator*(&local_2250,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,15,5,0,15,5>,Eigen::Matrix<double,5,5,0,5,5>,0>>
                 *)&local_2260,
                (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>_> *)
                &local_2268);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,15,15,0,15,15>,Eigen::Matrix<double,15,15,0,15,15>,0>,Eigen::Transpose<Eigen::Matrix<double,15,15,0,15,15>>,0>>
    ::operator+(&local_2208,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,15,15,0,15,15>,Eigen::Matrix<double,15,15,0,15,15>,0>,Eigen::Transpose<Eigen::Matrix<double,15,15,0,15,15>>,0>>
                 *)&local_2220,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_5,_0,_5,_5>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>,_0>_>
                 *)&local_2250);
    Eigen::Matrix<double,15,15,0,15,15>::operator=
              ((Matrix<double,15,15,0,15,15> *)&this->P_,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_15,_5,_0,_15,_5>,_Eigen::Matrix<double,_5,_5,_0,_5,_5>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_15,_5,_0,_15,_5>_>,_0>_>_>
                *)&local_2208);
    local_22a8 = 0.5;
    local_22c8 = (non_const_type)
                 Eigen::DenseBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_> *)&this->P_);
    Eigen::MatrixBase<Eigen::Matrix<double,15,15,0,15,15>>::operator+
              (&local_22c0,(MatrixBase<Eigen::Matrix<double,15,15,0,15,15>> *)&this->P_,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_> *)
               &local_22c8);
    Eigen::operator*(&local_22a0,&local_22a8,(StorageBaseType *)&local_22c0);
    Eigen::Matrix<double,15,15,0,15,15>::operator=
              ((Matrix<double,15,15,0,15,15> *)&this->P_,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_const_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_>_>_>
                *)&local_22a0);
  }
  return;
}

Assistant:

void InsEkf::Update() {

        if(!last_measurements_.hasNaN()){ // need GPS measurements to update

            // measurement model
            std::size_t gps_start = m_I(MI::gpsX);
            Eigen::Matrix<double, 5, 1> h = Eigen::Matrix<double, 5, 1>::Zero();

            Eigen::Vector4d q_BtoI;
            // quaternion of the vehicle's orientation estimate
            q_BtoI << -orientation_[0], -orientation_[1], -orientation_[2], orientation_[3];
            // GPS antenna offset from vehicle center rotated to inertial frame
            Eigen::Vector3d gps_offset_I = RotateVectByQuat(q_BtoI, gps_offset_);
            // expected GPS position measurement based on vehicle position
            h.block(m_I(MI::gpsX) - gps_start, 0, 3, 1) = position_ + gps_offset_I;

            Eigen::Vector3d pqr_est = last_measurements_.segment(m_I(MI::p), 3) - bias_g_;
            // motion of GPS antenna due to rotation at an offset about vehicle center, in body frame
            Eigen::Vector3d gps_rot_offset = SkewSymmetric(pqr_est) * gps_offset_;
            // transform to inertial frame
            Eigen::Vector3d gps_rot_offset_I = RotateVectByQuat(q_BtoI, gps_rot_offset);
            // velocity of GPS antenna in inertial frame
            Eigen::Vector3d gps_velocity_I = velocity_ + gps_rot_offset_I;

            // GPS velocity in inertial XY plane
            double Vxy_norm = gps_velocity_I.segment(0, 2).norm();
            // expeted GPS velocity measurement
            h(m_I(MI::gpsV) - gps_start, 0) = Vxy_norm;
            // expected GPS heading measurement
            h(m_I(MI::gpsPsi) - gps_start, 0) = atan2(gps_velocity_I[1], gps_velocity_I[0]); // atan2(Vy, Vx)

            // measurement model jacobian
            Eigen::Matrix<double, 5, s_I(SI::NUM_STATES)> H = Eigen::Matrix<double, 5, s_I(SI::NUM_STATES)>::Zero();
            H.block(m_I(MI::gpsX) - gps_start, s_I(SI::x), 3, 3) = Eigen::Matrix3d::Identity();

            Eigen::Matrix3d I_3 = Eigen::Matrix3d::Identity();
            // derivative of orientation rotation matrix wrt yaw angle
            Eigen::Matrix3d R_yaw = RPYToRotMat(Eigen::Vector3d{0.0, 0.0, -orientation_[2]});
            // derivative of orientation rotation matrix wrt pitch angle
            Eigen::Matrix3d R_pitch = RPYToRotMat(Eigen::Vector3d{0.0, -orientation_[1], 0.0});
            // derivatives of expected GPS position measurements wrt angle state estimates
            H.block(m_I(MI::gpsX) - gps_start, s_I(SI::roll), 3, 1) = -SkewSymmetric(gps_offset_I) * R_yaw * R_pitch * I_3.col(0); // d gps_offset_I / d roll
            H.block(m_I(MI::gpsX) - gps_start, s_I(SI::pitch), 3, 1) = -SkewSymmetric(gps_offset_I) * R_yaw * I_3.col(1); // d gps_offset_I / d pitch
            H.block(m_I(MI::gpsX) - gps_start, s_I(SI::yaw), 3, 1) = -SkewSymmetric(gps_offset_I) * I_3.col(2); // d gps_offset_I / d yaw

            // derivative of expected GPS velocity measurement wrt velocity state estimates
            H(m_I(MI::gpsV) - gps_start, s_I(SI::Vx)) = gps_velocity_I[0] / Vxy_norm; // Vx / norm(Vxy)
            H(m_I(MI::gpsV) - gps_start, s_I(SI::Vy)) = gps_velocity_I[1] / Vxy_norm; // Vy / norm(Vxy)

            // derivatives of of GPS antenna rotational motion wrt gyro bias state estimates
            Eigen::Vector3d d_gps_roI_d_biasGp = RotateVectByQuat(q_BtoI, SkewSymmetric(Eigen::Vector3d{-1.0, 0.0, 0.0})*gps_offset_);
            Eigen::Vector3d d_gps_roI_d_biasGq = RotateVectByQuat(q_BtoI, SkewSymmetric(Eigen::Vector3d{0.0, -1.0, 0.0})*gps_offset_);
            Eigen::Vector3d d_gps_roI_d_biasGr = RotateVectByQuat(q_BtoI, SkewSymmetric(Eigen::Vector3d{0.0, 0.0, -1.0})*gps_offset_);

            // derivatives of GPS antenna rotational motion wrt angle state estimates
            Eigen::Vector3d d_gps_roI_d_roll = -SkewSymmetric(gps_rot_offset_I) * R_yaw * R_pitch * I_3.col(0); // d gps_rot_offset_I / d roll
            Eigen::Vector3d d_gps_roI_d_pitch = -SkewSymmetric(gps_rot_offset_I) * R_yaw * I_3.col(1); // d gps_rot_offset_I / d pitch
            Eigen::Vector3d d_gps_roI_d_yaw = -SkewSymmetric(gps_rot_offset_I) * I_3.col(2); // d gps_rot_offset_I / d yaw

            // derivative of expected GPS velocity measurement wrt angle state estimates
            H(m_I(MI::gpsV) - gps_start, s_I(SI::roll)) = gps_velocity_I.segment(0, 2).dot(d_gps_roI_d_roll.segment(0, 2)) / Vxy_norm;
            H(m_I(MI::gpsV) - gps_start, s_I(SI::pitch)) = gps_velocity_I.segment(0, 2).dot(d_gps_roI_d_pitch.segment(0, 2)) / Vxy_norm;
            H(m_I(MI::gpsV) - gps_start, s_I(SI::yaw)) = gps_velocity_I.segment(0, 2).dot(d_gps_roI_d_yaw.segment(0, 2)) / Vxy_norm;

            // derivative of expected GPS velocity measurement wrt gyro bias state estimates
            H(m_I(MI::gpsV) - gps_start, s_I(SI::biasGp)) = gps_velocity_I.segment(0, 2).dot(d_gps_roI_d_biasGp.segment(0, 2)) / Vxy_norm;
            H(m_I(MI::gpsV) - gps_start, s_I(SI::biasGq)) = gps_velocity_I.segment(0, 2).dot(d_gps_roI_d_biasGq.segment(0, 2)) / Vxy_norm;
            H(m_I(MI::gpsV) - gps_start, s_I(SI::biasGr)) = gps_velocity_I.segment(0, 2).dot(d_gps_roI_d_biasGr.segment(0, 2)) / Vxy_norm;

            // derivative of expected GPS heading measurement wrt velocity state estimates
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::Vx)) = -gps_velocity_I[1] / pow(Vxy_norm, 2); // -Vy / norm(Vxy)^2
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::Vy)) = gps_velocity_I[0] / pow(Vxy_norm, 2); // Vx / norm(Vxy)^2

            // derivative of expected GPS heading measurement wrt angle state estimates
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::roll)) = (gps_velocity_I[0] * d_gps_roI_d_roll[1] - gps_velocity_I[1] * d_gps_roI_d_roll[0]) / pow(Vxy_norm, 2); // (Vx*dVy/droll - Vy*dVx/droll) / norm^2
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::pitch)) = (gps_velocity_I[0] * d_gps_roI_d_pitch[1] - gps_velocity_I[1] * d_gps_roI_d_pitch[0]) / pow(Vxy_norm, 2);
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::yaw)) = (gps_velocity_I[0] * d_gps_roI_d_yaw[1] - gps_velocity_I[1] * d_gps_roI_d_yaw[0]) / pow(Vxy_norm, 2);

            // derivative of expected GPS heading measurement wrt gyro bias state estimates
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::biasGp)) = (gps_velocity_I[0] * d_gps_roI_d_biasGp[1] - gps_velocity_I[1] * d_gps_roI_d_biasGp[0]) / pow(Vxy_norm, 2);
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::biasGq)) = (gps_velocity_I[0] * d_gps_roI_d_biasGq[1] - gps_velocity_I[1] * d_gps_roI_d_biasGq[0]) / pow(Vxy_norm, 2);
            H(m_I(MI::gpsPsi) - gps_start, s_I(SI::biasGr)) = (gps_velocity_I[0] * d_gps_roI_d_biasGr[1] - gps_velocity_I[1] * d_gps_roI_d_biasGr[0]) / pow(Vxy_norm, 2);

            // EKF update
            const Eigen::Matrix<double, 5, 5> Q_gps_diag = Q_gps_.asDiagonal();
            // covariance of residual
            Eigen::Matrix<double, 5, 5> S = H * P_ * H.transpose() + Q_gps_diag;

            Eigen::Matrix<double, 5, 5> S_inverse = Eigen::Matrix<double, 5, 5>::Identity();
            S.selfadjointView<Eigen::Upper>().llt().solveInPlace(S_inverse);
            // Kalman gain = P * H'/ S
            Eigen::Matrix<double, s_I(SI::NUM_STATES), 5> K = P_ * H.transpose() * S_inverse;

            Eigen::Matrix<double, 5, 1> residual = last_measurements_.segment(m_I(MI::gpsX), 5) - h;

            // update the states
            Eigen::Matrix<double, s_I(SI::NUM_STATES), 1> dx = K * residual;
            Eigen::Vector4d dq {0.5 * dx[s_I(SI::roll)], 0.5 * dx[s_I(SI::pitch)], 0.5 * dx[s_I(SI::yaw)], 1.0}; // small angle approximation
            dq /= dq.norm();
            orientation_ = QuatMultiply(dq, orientation_);
            orientation_ /= orientation_.norm();
            position_ += dx.block(s_I(SI::x), 0, 3, 1);
            velocity_ += dx.block(s_I(SI::Vx), 0, 3, 1);
            bias_g_ += dx.block(s_I(SI::biasGp), 0, 3, 1);
            bias_a_ += dx.block(s_I(SI::biasAx), 0, 3, 1);

            // update the covariance
            Eigen::Matrix<double, s_I(SI::NUM_STATES), s_I(SI::NUM_STATES)> I_KH =
                    Eigen::Matrix<double, s_I(SI::NUM_STATES), s_I(SI::NUM_STATES)>::Identity() - K * H;

            P_ = I_KH * P_ * I_KH.transpose() + K * Q_gps_diag * K.transpose();
            P_ = 0.5 * (P_ + P_.transpose());
            //P_ -= K * H * P_;

        }
    }